

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

edata_t * duckdb_je_ecache_alloc_grow
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *expand_edata
                    ,size_t size,size_t alignment,_Bool zero,_Bool guarded)

{
  int8_t *piVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  ecache_t *ecache_00;
  atomic_zu_t *paVar4;
  size_t sVar5;
  pszind_t pVar6;
  uint uVar7;
  extent_hooks_t *peVar8;
  ehooks_t *ehooks_00;
  _Bool _Var9;
  int iVar10;
  extent_split_interior_result_t eVar11;
  uint uVar12;
  edata_t *peVar13;
  edata_t *peVar14;
  tsd_t *ptVar15;
  void *pvVar16;
  edata_cache_t *edata_cache;
  int iVar17;
  ulong uVar18;
  undefined1 growing_retained;
  edata_t **trail_00;
  int iVar19;
  size_t in_stack_ffffffffffffff68;
  _Bool commit;
  _Bool committed;
  _Bool zeroed;
  ehooks_t *local_88;
  edata_t *edata;
  pac_t *local_78;
  pthread_mutex_t *local_70;
  edata_t *local_68;
  edata_t *local_60;
  ulong local_58;
  edata_t *local_50;
  edata_t *to_leak;
  edata_t *trail;
  edata_t *lead;
  
  commit = true;
  local_70 = (pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48);
  local_68 = (edata_t *)size;
  local_60 = expand_edata;
  iVar10 = pthread_mutex_trylock(local_70);
  if (iVar10 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pac->grow_mtx);
    (pac->grow_mtx).field_0.field_0.locked.repr = true;
  }
  peVar14 = local_60;
  puVar2 = &(pac->grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((pac->grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pac->grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(pac->grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  ecache_00 = &pac->ecache_retained;
  local_58 = (ulong)zero;
  local_88 = ehooks;
  peVar13 = extent_recycle(tsdn,pac,ehooks,ecache_00,local_60,(size_t)local_68,alignment,zero,
                           &commit,true,guarded);
  local_78 = pac;
  if (peVar13 != (edata_t *)0x0) {
    (pac->grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_70);
    goto LAB_01dadd83;
  }
  if ((peVar14 != (edata_t *)0x0 || guarded) || duckdb_je_opt_retain != true) {
    (pac->grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_70);
    peVar13 = (edata_t *)0x0;
    goto LAB_01dadd83;
  }
  peVar14 = (edata_t *)((long)&local_68[-0x20].e_bits + (alignment + 0xfff & 0xfffffffffffff000));
  if (local_68 <= peVar14) {
    pVar6 = (pac->exp_grow).next;
    iVar10 = 0;
    do {
      peVar13 = (edata_t *)duckdb_je_sz_pind2sz_tab[pVar6 + iVar10];
      iVar19 = iVar10;
      if (peVar14 <= peVar13) break;
      iVar19 = iVar10 + 1;
      iVar17 = pVar6 + iVar10;
      iVar10 = iVar19;
    } while (iVar17 + 1U < 0xc6);
    if ((peVar14 <= peVar13) &&
       (edata = duckdb_je_edata_cache_get(tsdn,pac->edata_cache), edata != (edata_t *)0x0)) {
      zeroed = false;
      committed = false;
      peVar8 = (extent_hooks_t *)(local_88->ptr).repr;
      if (peVar8 == &duckdb_je_ehooks_default_extent_hooks) {
        pvVar16 = duckdb_je_ehooks_default_alloc_impl
                            (tsdn,(void *)0x0,(size_t)peVar13,0x1000,&zeroed,&committed,
                             local_88->ind);
      }
      else {
        ptVar15 = &tsdn->tsd;
        if ((tsdn == (tsdn_t *)0x0) &&
           (ptVar15 = (tsd_t *)__tls_get_addr(&PTR_024daac8), (ptVar15->state).repr != '\0')) {
          ptVar15 = duckdb_je_tsd_fetch_slow(ptVar15,false);
        }
        ptVar15->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
             ptVar15->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level +
             '\x01';
        if ((ptVar15->state).repr == '\0') {
          duckdb_je_tsd_slow_update(ptVar15);
        }
        pvVar16 = (*peVar8->alloc)(peVar8,(void *)0x0,(size_t)peVar13,0x1000,&zeroed,&committed,
                                   local_88->ind);
        ptVar15 = &tsdn->tsd;
        if ((tsdn == (tsdn_t *)0x0) &&
           (ptVar15 = (tsd_t *)__tls_get_addr(&PTR_024daac8), (ptVar15->state).repr != '\0')) {
          ptVar15 = duckdb_je_tsd_fetch_slow(ptVar15,false);
        }
        piVar1 = &ptVar15->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == '\0') {
          duckdb_je_tsd_slow_update(ptVar15);
        }
      }
      peVar14 = edata;
      if (pvVar16 == (void *)0x0) {
        edata_cache = pac->edata_cache;
      }
      else {
        uVar7 = (pac->ecache_retained).ind;
        LOCK();
        paVar4 = &pac->duckdb_je_extent_sn_next;
        sVar5 = paVar4->repr;
        paVar4->repr = paVar4->repr + 1;
        UNLOCK();
        uVar18 = 0x100000008000;
        edata->e_addr = pvVar16;
        (edata->field_2).e_size_esn =
             (ulong)((uint)(edata->field_2).e_size_esn & 0xfff) | (ulong)peVar13;
        edata->e_sn = sVar5;
        if (zeroed == false) {
          uVar18 = 0x100000000000;
        }
        edata->e_bits =
             uVar18 | (ulong)committed << 0xd |
             edata->e_bits & 0xffffeffff0000000 | (ulong)uVar7 & 0xffffeffffe800fff | 0xe800000;
        _Var9 = duckdb_je_emap_register_boundary(tsdn,pac->emap,edata,0xe8,false);
        ehooks_00 = local_88;
        if (!_Var9) {
          if ((peVar14->e_bits & 0x2000) != 0) {
            commit = true;
          }
          to_leak = (edata_t *)0x0;
          local_50 = (edata_t *)0x0;
          trail_00 = &trail;
          eVar11 = extent_split_interior
                             (tsdn,pac,local_88,&edata,&lead,trail_00,&to_leak,&local_50,local_68,
                              alignment,in_stack_ffffffffffffff68);
          growing_retained = SUB81(trail_00,0);
          if (eVar11 == extent_split_interior_ok) {
            if (lead != (edata_t *)0x0) {
              duckdb_je_extent_record(tsdn,pac,ehooks_00,ecache_00,lead);
            }
            if (trail != (edata_t *)0x0) {
              duckdb_je_extent_record(tsdn,pac,ehooks_00,ecache_00,trail);
            }
            peVar14 = edata;
            if (((commit != true) || ((edata->e_bits & 0x2000) != 0)) ||
               (_Var9 = extent_commit_impl(tsdn,local_88,edata,0,
                                           (edata->field_2).e_size_esn & 0xfffffffffffff000,
                                           (_Bool)growing_retained), !_Var9)) {
              uVar7 = (pac->exp_grow).limit;
              uVar12 = (pac->exp_grow).next + iVar19 + 1;
              if (uVar12 < uVar7) {
                uVar7 = uVar12;
              }
              (pac->exp_grow).next = uVar7;
              (pac->grow_mtx).field_0.field_0.locked.repr = false;
              pthread_mutex_unlock(local_70);
              peVar13 = edata;
              if ((zero) && ((edata->e_bits & 0x8000) == 0)) {
                pvVar16 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
                uVar18 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
                if ((extent_hooks_t *)(local_88->ptr).repr == &duckdb_je_ehooks_default_extent_hooks
                   ) {
                  duckdb_je_ehooks_default_zero_impl(pvVar16,uVar18);
                  peVar13 = edata;
                }
                else {
                  switchD_01306cb1::default(pvVar16,0,uVar18);
                  peVar13 = edata;
                }
              }
              goto LAB_01dadd83;
            }
            duckdb_je_extent_record(tsdn,pac,local_88,ecache_00,peVar14);
          }
          else {
            if (local_50 != (edata_t *)0x0) {
              duckdb_je_extent_record(tsdn,pac,ehooks_00,ecache_00,local_50);
            }
            peVar14 = to_leak;
            if (to_leak != (edata_t *)0x0) {
              duckdb_je_emap_deregister_boundary(tsdn,pac->emap,to_leak);
              extents_abandon_vm(tsdn,pac,local_88,ecache_00,peVar14,(_Bool)growing_retained);
            }
          }
          goto LAB_01dae05c;
        }
        edata_cache = pac->edata_cache;
      }
      duckdb_je_edata_cache_put(tsdn,edata_cache,peVar14);
    }
  }
LAB_01dae05c:
  (pac->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(local_70);
  peVar13 = (edata_t *)0x0;
LAB_01dadd83:
  if (peVar13 == (edata_t *)0x0) {
    if ((local_60 != (edata_t *)0x0 & duckdb_je_opt_retain) == 0 && !guarded) {
      if (local_60 == (edata_t *)0x0) {
        pvVar16 = (void *)0x0;
      }
      else {
        pvVar16 = (void *)(((local_60->field_2).e_size_esn & 0xfffffffffffff000) +
                          ((ulong)local_60->e_addr & 0xfffffffffffff000));
      }
      peVar13 = duckdb_je_extent_alloc_wrapper
                          (tsdn,local_78,local_88,pvVar16,(size_t)local_68,alignment,
                           SUB81(local_58,0),&commit,false);
    }
    else {
      peVar13 = (edata_t *)0x0;
    }
  }
  return peVar13;
}

Assistant:

edata_t *
ecache_alloc_grow(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool guarded) {
	assert(size != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	bool commit = true;
	edata_t *edata = extent_alloc_retained(tsdn, pac, ehooks, expand_edata,
	    size, alignment, zero, &commit, guarded);
	if (edata == NULL) {
		if (opt_retain && expand_edata != NULL) {
			/*
			 * When retain is enabled and trying to expand, we do
			 * not attempt extent_alloc_wrapper which does mmap that
			 * is very unlikely to succeed (unless it happens to be
			 * at the end).
			 */
			return NULL;
		}
		if (guarded) {
			/*
			 * Means no cached guarded extents available (and no
			 * grow_retained was attempted).  The pac_alloc flow
			 * will alloc regular extents to make new guarded ones.
			 */
			return NULL;
		}
		void *new_addr = (expand_edata == NULL) ? NULL :
		    edata_past_get(expand_edata);
		edata = extent_alloc_wrapper(tsdn, pac, ehooks, new_addr,
		    size, alignment, zero, &commit,
		    /* growing_retained */ false);
	}

	assert(edata == NULL || edata_pai_get(edata) == EXTENT_PAI_PAC);
	return edata;
}